

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
pbrt::
InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator=(InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *other)

{
  undefined8 *puVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  
  if (this != other) {
    clear(this);
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      pbVar9 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = pbVar9;
      sVar2 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar2;
      sVar2 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar2;
      if ((this->nStored != 0) &&
         (this->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        puVar4 = (undefined8 *)((long)&other->field_2 + 0x10);
        puVar5 = (undefined8 *)((long)&this->field_2 + 0x10);
        uVar7 = 0;
        do {
          puVar5[-2] = puVar5;
          if (puVar4 == (undefined8 *)puVar4[-2]) {
            uVar3 = puVar4[1];
            *puVar5 = *puVar4;
            puVar5[1] = uVar3;
          }
          else {
            puVar5[-2] = (undefined8 *)puVar4[-2];
            *puVar5 = *puVar4;
          }
          uVar7 = uVar7 + 1;
          puVar5[-1] = puVar4[-1];
          puVar4[-2] = puVar4;
          puVar4[-1] = 0;
          *(undefined1 *)puVar4 = 0;
          puVar4 = puVar4 + 4;
          puVar5 = puVar5 + 4;
        } while (uVar7 < this->nStored);
        other->nStored = this->nStored;
      }
    }
    else {
      reserve(this,other->nStored);
      if (other->nStored == 0) {
        uVar7 = 0;
      }
      else {
        lVar6 = 0x10;
        uVar8 = 0;
        do {
          pbVar9 = this->ptr;
          if (this->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &this->field_2;
          }
          puVar4 = (undefined8 *)((long)&pbVar9->_M_dataplus + lVar6);
          pbVar10 = other->ptr;
          if (other->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &other->field_2;
          }
          *(undefined8 **)((long)pbVar9 + lVar6 + -0x10) = puVar4;
          puVar5 = (undefined8 *)((long)&pbVar10->_M_dataplus + lVar6);
          puVar1 = *(undefined8 **)((long)pbVar10 + lVar6 + -0x10);
          if (puVar5 == puVar1) {
            uVar3 = puVar5[1];
            *puVar4 = *puVar5;
            puVar4[1] = uVar3;
          }
          else {
            *(undefined8 **)((long)pbVar9 + lVar6 + -0x10) = puVar1;
            *(undefined8 *)((long)&pbVar9->_M_dataplus + lVar6) = *puVar5;
          }
          uVar8 = uVar8 + 1;
          *(undefined8 *)((long)pbVar9 + lVar6 + -8) = *(undefined8 *)((long)pbVar10 + lVar6 + -8);
          *(undefined8 **)((long)pbVar10 + lVar6 + -0x10) = puVar5;
          *(undefined8 *)((long)pbVar10 + lVar6 + -8) = 0;
          *(undefined1 *)((long)&pbVar10->_M_dataplus + lVar6) = 0;
          lVar6 = lVar6 + 0x20;
          uVar7 = other->nStored;
        } while (uVar8 < uVar7);
      }
      this->nStored = uVar7;
    }
  }
  return this;
}

Assistant:

InlinedVector &operator=(InlinedVector &&other) {
        if (this == &other)
            return *this;

        clear();
        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
            if (nStored > 0 && ptr == nullptr) {
                for (int i = 0; i < nStored; ++i)
                    alloc.template construct<T>(fixed + i, std::move(other.fixed[i]));
                other.nStored = nStored;  // so that dtors run...
            }
        } else {
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(begin() + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }